

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPResponse.cpp
# Opt level: O3

void __thiscall
HTTPResponse::HTTPResponse
          (HTTPResponse *this,int statusCode,string *status,string *contentType,string *content)

{
  int iVar1;
  pointer pcVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  char cVar6;
  ostream *poVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  size_type sVar12;
  uint __len;
  char cVar13;
  uint __val;
  string header;
  stringstream ss;
  long *local_200;
  uint local_1f8;
  undefined4 uStack_1f4;
  long local_1f0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  string *local_1d0;
  string *local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  this->statusCode = statusCode;
  local_1c8 = &this->status;
  local_1d8 = &(this->status).field_2;
  (this->status)._M_dataplus._M_p = (pointer)local_1d8;
  pcVar2 = (status->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,pcVar2,pcVar2 + status->_M_string_length);
  local_1d0 = &this->contentType;
  local_1e0 = &(this->contentType).field_2;
  (this->contentType)._M_dataplus._M_p = (pointer)local_1e0;
  pcVar2 = (contentType->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,pcVar2,pcVar2 + contentType->_M_string_length);
  this->responseSize = 0;
  local_1c0 = contentType;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"HTTP/1.1 ",9);
  __val = -statusCode;
  if (0 < statusCode) {
    __val = statusCode;
  }
  __len = 1;
  if (9 < __val) {
    uVar11 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar9 = (uint)uVar11;
      if (uVar9 < 100) {
        __len = __len - 2;
        goto LAB_00106c3e;
      }
      if (uVar9 < 1000) {
        __len = __len - 1;
        goto LAB_00106c3e;
      }
      if (uVar9 < 10000) goto LAB_00106c3e;
      uVar11 = uVar11 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar9);
    __len = __len + 1;
  }
LAB_00106c3e:
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct((ulong)&local_200,(char)__len - (char)(statusCode >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_200 + (ulong)((uint)statusCode >> 0x1f)),__len,__val);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(char *)local_200,CONCAT44(uStack_1f4,local_1f8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(status->_M_dataplus)._M_p,status->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Content-Type: ",0xe);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(local_1c0->_M_dataplus)._M_p,local_1c0->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Content-Length: ",0x10);
  uVar11 = content->_M_string_length;
  cVar13 = '\x01';
  if (9 < uVar11) {
    uVar10 = uVar11;
    cVar6 = '\x04';
    do {
      cVar13 = cVar6;
      if (uVar10 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_00106d88;
      }
      if (uVar10 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_00106d88;
      }
      if (uVar10 < 10000) goto LAB_00106d88;
      bVar3 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar6 = cVar13 + '\x04';
    } while (bVar3);
    cVar13 = cVar13 + '\x01';
  }
LAB_00106d88:
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct((ulong)&local_200,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_200,local_1f8,uVar11);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(char *)local_200,CONCAT44(uStack_1f4,local_1f8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n\n",2);
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  lVar4 = CONCAT44(uStack_1f4,local_1f8);
  sVar12 = content->_M_string_length;
  pcVar8 = (char *)operator_new__(lVar4 + sVar12 + 4);
  this->response = pcVar8;
  if (lVar4 != 0) {
    uVar11 = 0;
    do {
      cVar13 = *(char *)((long)local_200 + uVar11);
      iVar1 = this->responseSize;
      this->responseSize = iVar1 + 1;
      this->response[iVar1] = cVar13;
      uVar11 = uVar11 + 1;
    } while (uVar11 < CONCAT44(uStack_1f4,local_1f8));
    sVar12 = content->_M_string_length;
  }
  if (sVar12 != 0) {
    uVar11 = 0;
    do {
      cVar13 = (content->_M_dataplus)._M_p[uVar11];
      iVar1 = this->responseSize;
      this->responseSize = iVar1 + 1;
      this->response[iVar1] = cVar13;
      uVar11 = uVar11 + 1;
    } while (uVar11 < content->_M_string_length);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

HTTPResponse::HTTPResponse(int statusCode, const std::string& status, const std::string& contentType, const std::string& content)
    : statusCode(statusCode), status(status), contentType(contentType)
{
    responseSize = 0;

    std::stringstream ss;
    ss << "HTTP/1.1 ";
    ss << std::to_string(statusCode) << " ";
    ss << status << "\n";
    ss << "Content-Type: " << contentType << "\n";
    ss << "Content-Length: " << std::to_string(content.size()) << "\n\n";

    std::string header = ss.str();
    this->response = new char[header.size() + content.size() + 4];
    for (int i = 0; i < header.size(); i++)
        response[responseSize++] = header[i];
    for (int i = 0; i < content.size(); i++)
        response[responseSize++] = content[i];
}